

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack26_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar6 = *(undefined1 (*) [16])(in + 1);
  auVar3 = vpmovsxbd_avx(ZEXT416(0x2010004));
  uVar1 = *in;
  *out = uVar1 & 0x3ffffff;
  uVar2 = in[4];
  auVar4 = vpermi2d_avx512vl(auVar3,auVar6,ZEXT416(uVar1));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(in + 5);
  auVar3 = vpalignr_avx(auVar7,auVar6,0xc);
  auVar5 = vpshldvd_avx512_vbmi2(auVar6,auVar4,_DAT_0019db90);
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001aa440);
  auVar6 = vpsllvd_avx2(auVar7,_DAT_0019d5b0);
  auVar4._8_4_ = 0x3ffffff;
  auVar4._0_8_ = 0x3ffffff03ffffff;
  auVar4._12_4_ = 0x3ffffff;
  auVar4 = vpandd_avx512vl(auVar5,auVar4);
  auVar5._8_4_ = 0x3fffff0;
  auVar5._0_8_ = 0x3fffc0003fffff0;
  auVar5._12_4_ = 0x3fffc00;
  auVar6 = vpternlogq_avx512vl(auVar6,auVar3,auVar5,0xec);
  *(undefined1 (*) [16])(out + 1) = auVar4;
  out[5] = uVar2 >> 2 & 0x3ffffff;
  *(long *)(out + 6) = auVar6._0_8_;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack26_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 20)) << (26 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 14)) << (26 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 8)) << (26 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 2)) << (26 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 26);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 22)) << (26 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 16)) << (26 - 16);
  out++;

  return in + 1;
}